

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O3

void Iso_ManRehashClassNodes(Iso_Man_t *p)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  long lVar7;
  Iso_Obj_t *pIVar8;
  
  p->vTemp1->nSize = 0;
  p->vTemp2->nSize = 0;
  pVVar5 = p->vClasses;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      pIVar8 = (Iso_Obj_t *)pVVar5->pArray[lVar7];
      if (pIVar8 != (Iso_Obj_t *)0x0) {
        while( true ) {
          if (pIVar8->Id == 0) {
            pVVar5 = p->vTemp1;
          }
          else {
            pVVar5 = p->vTemp2;
          }
          uVar1 = pVVar5->nSize;
          if (uVar1 == pVVar5->nCap) {
            if ((int)uVar1 < 0x10) {
              if (pVVar5->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar5->pArray,0x80);
              }
              pVVar5->pArray = ppvVar4;
              pVVar5->nCap = 0x10;
            }
            else {
              if (pVVar5->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar5->pArray,(ulong)uVar1 << 4);
              }
              pVVar5->pArray = ppvVar4;
              pVVar5->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar4 = pVVar5->pArray;
          }
          iVar2 = pVVar5->nSize;
          pVVar5->nSize = iVar2 + 1;
          ppvVar4[iVar2] = pIVar8;
          iVar2 = pIVar8->iClass;
          if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
            __assert_fail("i >= 0 && i < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                          ,300,"Iso_Obj_t *Iso_ManObj(Iso_Man_t *, int)");
          }
          if (iVar2 == 0) break;
          pIVar8 = p->pObjs + iVar2;
        }
        pVVar5 = p->vClasses;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar5->nSize);
  }
  p->nClasses = 0;
  p->nEntries = 0;
  p->nSingles = 0;
  memset(p->pBins,0,(long)p->nBins << 2);
  pVVar5 = p->vTemp1;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      pIVar8 = (Iso_Obj_t *)pVVar5->pArray[lVar7];
      if (pIVar8->Id != 0) {
        __assert_fail("pTemp->Id == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                      ,0x3d8,"void Iso_ManRehashClassNodes(Iso_Man_t *)");
      }
      pIVar8->iNext = 0;
      pIVar8->iClass = 0;
      Iso_ObjHashAdd(p,pIVar8);
      lVar7 = lVar7 + 1;
      pVVar5 = p->vTemp1;
    } while (lVar7 < pVVar5->nSize);
  }
  lVar7 = (long)p->vTemp2->nSize;
  if (0 < lVar7) {
    ppvVar4 = p->vTemp2->pArray;
    lVar6 = 0;
    do {
      pvVar3 = ppvVar4[lVar6];
      if (*(int *)((long)pvVar3 + 0x14) == 0) {
        __assert_fail("pTemp->Id != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                      ,0x3de,"void Iso_ManRehashClassNodes(Iso_Man_t *)");
      }
      *(undefined8 *)((long)pvVar3 + 0xc) = 0;
      lVar6 = lVar6 + 1;
    } while (lVar7 != lVar6);
  }
  Iso_ManCollectClasses(p);
  return;
}

Assistant:

void Iso_ManRehashClassNodes( Iso_Man_t * p )
{
    Iso_Obj_t * pIso, * pTemp;
    int i;
    // collect nodes
    Vec_PtrClear( p->vTemp1 );
    Vec_PtrClear( p->vTemp2 );
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vClasses, pIso, i )
    {
        for ( pTemp = pIso; pTemp; pTemp = Iso_ManObj(p, pTemp->iClass) )
            if ( pTemp->Id == 0 )
                Vec_PtrPush( p->vTemp1, pTemp );
            else
                Vec_PtrPush( p->vTemp2, pTemp );
    }
    // clean and add nodes
    p->nClasses = 0;       // total number of classes
    p->nEntries = 0;       // total number of entries
    p->nSingles = 0;       // total number of singletons
    memset( p->pBins, 0, sizeof(int) * p->nBins );
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vTemp1, pTemp, i )
    {
        assert( pTemp->Id == 0 );
        pTemp->iClass = pTemp->iNext = 0;
        Iso_ObjHashAdd( p, pTemp );
    }
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vTemp2, pTemp, i )
    {
        assert( pTemp->Id != 0 );
        pTemp->iClass = pTemp->iNext = 0;
    }
    // collect new classes
    Iso_ManCollectClasses( p );
}